

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (string_t *__return_storage_ptr__,DefaultLogBuilder *this,LogMessage *logMessage,
          bool appendNewLine)

{
  Level LVar1;
  TypedConfigurations *this_00;
  pointer pcVar2;
  pointer pcVar3;
  long *plVar4;
  _Base_ptr *pp_Var5;
  uint uVar6;
  LogFormat *pLVar7;
  iterator iVar8;
  SubsecondPrecision *format;
  size_t sVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined7 in_register_00000009;
  _Base_ptr p_Var12;
  char *buf;
  char *buff_00;
  undefined8 *puVar13;
  SubsecondPrecision *in_R9;
  timeval tval;
  string fs;
  string_t wcsFormatSpecifier;
  timeval currTime;
  char buff [110];
  string_t local_130;
  string_t *local_110;
  string_t local_108;
  LogMessage *local_e8;
  undefined4 local_dc;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  LogMessage *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  char local_3a [10];
  
  local_dc = (undefined4)CONCAT71(in_register_00000009,appendNewLine);
  this_00 = logMessage->m_logger->m_typedConfigurations;
  LVar1 = logMessage->m_level;
  local_e8 = logMessage;
  (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
  pLVar7 = TypedConfigurations::unsafeGetConfigByRef<el::base::LogFormat>
                     (this_00,LVar1,&this_00->m_logFormatMap,"logFormat");
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  pcVar2 = (pLVar7->m_format)._M_dataplus._M_p;
  local_110 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pLVar7->m_format)._M_string_length);
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uVar6 = pLVar7->m_flags;
  if ((uVar6 >> 0xb & 1) != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%app","");
    utils::Str::replaceFirstWithEscape
              (local_110,&local_130,(string_t *)&local_e8->m_logger->m_parentApplicationName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 >> 0xc & 1) != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%thread","");
    plVar4 = elStorage;
    local_d8._8_8_ = (_Base_ptr)0x0;
    local_c8._M_local_buf[0] = '\0';
    local_d8._0_8_ = (DateTime *)(local_d8 + 0x10);
    iVar8 = utils::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(elStorage + 0x22),(key_type *)local_d8);
    p_Var12 = iVar8._M_node + 2;
    pp_Var5 = &iVar8._M_node[2]._M_parent;
    if (iVar8._M_node == (_Base_ptr)(plVar4 + 0x23)) {
      p_Var12 = (_Base_ptr)local_d8;
      pp_Var5 = (_Base_ptr *)(local_d8 + 8);
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,*(long *)p_Var12,(long)&(*pp_Var5)->_M_color + *(long *)p_Var12)
    ;
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((DateTime *)local_d8._0_8_ != (DateTime *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 & 2) != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%datetime","");
    pcVar3 = (pLVar7->m_dateTimeFormat)._M_dataplus._M_p;
    LVar1 = local_e8->m_level;
    (*(this_00->super_ThreadSafe)._vptr_ThreadSafe[2])(this_00);
    format = TypedConfigurations::unsafeGetConfigByRef<el::base::SubsecondPrecision>
                       (this_00,LVar1,&this_00->m_subsecondPrecisionMap,"subsecondPrecision");
    gettimeofday((timeval *)local_d8,(__timezone_ptr_t)0x0);
    tval.tv_usec = (__suseconds_t)pcVar3;
    tval.tv_sec = local_d8._8_8_;
    utils::DateTime::timevalToString_abi_cxx11_
              ((string *)&local_108,(DateTime *)local_d8._0_8_,tval,(char *)format,in_R9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 & 0x40) != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%func","");
    utils::Str::replaceFirstWithEscape(local_110,&local_130,(string_t *)&local_e8->m_func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 & 8) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_e8->m_file)._M_dataplus._M_p,(char *)&local_a8,100);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%file","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    sVar9 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a8,(long)&local_a8 + sVar9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 >> 0xe & 1) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildBaseFilename(&local_e8->m_file,(char *)&local_a8,100,"/");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%fbase","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    sVar9 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a8,(long)&local_a8 + sVar9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 & 0x10) != 0) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff(local_e8->m_line,10,(char *)&local_a8,local_3a,false);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%line","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    sVar9 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a8,(long)&local_a8 + sVar9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 & 0x20) != 0) {
    buff_00 = (char *)&local_a8;
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_e8->m_file)._M_dataplus._M_p,buff_00,100);
    uVar10 = 0;
    do {
      if (*buff_00 == '\0') {
        buf = buff_00;
        if ((uVar10 < 0x6e) && (*buff_00 = ':', buf = local_3a, uVar10 != 0x6d)) {
          buff_00[1] = '\0';
          buf = buff_00 + 1;
        }
        break;
      }
      buff_00 = buff_00 + 1;
      uVar10 = uVar10 + 1;
      buf = local_3a;
    } while (uVar10 != 0x6e);
    utils::Str::convertAndAddToBuff(local_e8->m_line,10,buf,local_3a,false);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%loc","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    sVar9 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a8,(long)&local_a8 + sVar9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((local_e8->m_level == Verbose) && ((uVar6 & 0x400) != 0)) {
    local_a8 = local_a8 & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff
              ((ulong)local_e8->m_verboseLevel,1,(char *)&local_a8,local_3a,false);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%vlevel","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    sVar9 = strlen((char *)&local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a8,(long)&local_a8 + sVar9);
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar6 = pLVar7->m_flags;
  }
  if ((uVar6 >> 9 & 1) != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"%msg","");
    utils::Str::replaceFirstWithEscape(local_110,&local_130,&local_e8->m_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  (**(code **)(*elStorage + 0x10))();
  puVar13 = (undefined8 *)elStorage[0x28];
  if (puVar13 != (undefined8 *)elStorage[0x29]) {
    do {
      std::__cxx11::string::string((string *)&local_130,(char *)*puVar13,(allocator *)&local_108);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_108,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      local_b0 = local_e8;
      if (puVar13[3] == 0) {
        uVar11 = std::__throw_bad_function_call();
        plVar4 = (long *)(local_110->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar4 != local_b8) {
          operator_delete(plVar4,local_b8->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar11);
      }
      (*(code *)puVar13[4])((string_t *)local_d8,puVar13 + 1,&local_b0);
      utils::Str::replaceFirstWithEscape(local_110,&local_108,(string_t *)local_d8);
      if ((DateTime *)local_d8._0_8_ != (DateTime *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,
                        CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      puVar13 = puVar13 + 5;
    } while (puVar13 != (undefined8 *)elStorage[0x29]);
  }
  if ((char)local_dc != '\0') {
    std::__cxx11::string::append((char *)local_110);
  }
  return local_110;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->lock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}